

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O0

void test_mu_timeout_stress(testing t)

{
  int iVar1;
  nsync_time nVar2;
  nsync_time b;
  __syscall_slong_t local_100;
  nsync_time deadline;
  cv_stress_data s;
  uintmax_t loop_count;
  testing t_local;
  
  nVar2 = nsync::nsync_time_now();
  b = nsync::nsync_time_ms(5000);
  nVar2 = nsync::nsync_time_add(nVar2,b);
  local_100 = nVar2.tv_nsec;
  deadline.tv_sec = local_100;
  do {
    memset(&deadline.tv_nsec,0,0xd0);
    iVar1 = run_stress_test((cv_stress_data *)&deadline.tv_nsec,t,"test_mu_timeout_stress");
  } while (iVar1 == 0);
  return;
}

Assistant:

static void test_mu_timeout_stress (testing t) {
	uintmax_t loop_count = 3;
	cv_stress_data s;
	nsync_time deadline;
	deadline = nsync_time_add (nsync_time_now (), nsync_time_ms (5000));
	do {
		memset ((void *) &s, 0, sizeof (s));
		s.loop_count = loop_count;
		s.cv_threads_per_value = 0;
		s.cv_reader_threads_per_value = 0;
		s.mu_threads_per_value = 4;
		s.mu_reader_threads_per_value = 2;
		s.deadline = deadline;
		loop_count *= 2;
	} while (!run_stress_test (&s, t, "test_mu_timeout_stress"));
}